

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_error.cpp
# Opt level: O0

uint __thiscall ON_ErrorLog::Append(ON_ErrorLog *this,ON_ErrorEvent *error_event)

{
  uint uVar1;
  uint event_capacity;
  ON_ErrorEvent *error_event_local;
  ON_ErrorLog *this_local;
  
  if (this->m_event_count < 0x20) {
    if (this->m_event_count < 0x20) {
      uVar1 = this->m_event_count;
      this->m_event_count = uVar1 + 1;
      ON_ErrorEvent::operator=(this->m_events + uVar1,error_event);
      if ((this->m_event_count == 0x20) && (ON_ACTIVE_ERROR_LOG == this)) {
        ON_ACTIVE_ERROR_LOG = (ON_ErrorLog *)0x0;
      }
    }
    this_local._4_4_ = this->m_event_count;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

unsigned int ON_ErrorLog::Append(
  const ON_ErrorEvent& error_event
)
{
  const unsigned int event_capacity = (unsigned int)(sizeof(m_events) / sizeof(m_events[0]));
  if (m_event_count >= event_capacity)
    return 0;

  if (m_event_count < event_capacity)
  {
    m_events[m_event_count++] = error_event;
    if (m_event_count == event_capacity && ON_ACTIVE_ERROR_LOG == this)
    {
      // stop wasting time logging errors
      ON_ACTIVE_ERROR_LOG = nullptr;
    }
  }
  return m_event_count;
}